

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall cfd::js::api::json::ConvertAesRequest::ConvertAesRequest(ConvertAesRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  (this->super_JsonClassBase<cfd::js::api::json::ConvertAesRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ConvertAesRequest_00b38a50;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->is_encrypt_ = true;
  std::__cxx11::string::string((string *)&this->mode_,"cbc",&local_31);
  std::__cxx11::string::string((string *)&this->key_,"",&local_32);
  std::__cxx11::string::string((string *)&this->iv_,"",&local_33);
  std::__cxx11::string::string((string *)&this->data_,"",&local_34);
  CollectFieldName();
  return;
}

Assistant:

ConvertAesRequest() {
    CollectFieldName();
  }